

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  parasail_result_t *ppVar9;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined4 uVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i_64_t B_7;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar62;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i_64_t B_1;
  ulong uVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i_64_t B_4;
  undefined1 auVar68 [16];
  long lVar69;
  __m128i_64_t B_10;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  long lVar73;
  __m128i_64_t B;
  undefined1 auVar74 [16];
  ulong uVar75;
  __m128i_64_t B_8;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar78;
  __m128i_64_t B_6;
  undefined1 auVar79 [16];
  long lVar80;
  __m128i_64_t B_9;
  long lVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i vMaxH;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  long lStack_2d0;
  int64_t local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_298 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  ulong local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_150;
  int64_t *local_148;
  long local_140;
  int *local_138;
  ulong local_130;
  ulong local_128;
  int *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  ulong local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  int local_c8;
  undefined4 uStack_c4;
  int iStack_c0;
  undefined4 uStack_bc;
  long local_b8;
  long lStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  long local_78;
  long lStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar17;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar26 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_table_diag_sse41_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sw_stats_table_diag_sse41_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_006dd96a;
  }
  _s1Len = matrix->length;
LAB_006dd96a:
  local_318._8_8_ = local_318._0_8_;
  iVar10 = matrix->min;
  uVar11 = 0x8000000000000000 - (long)iVar10;
  if (iVar10 != -open && SBORROW4(iVar10,-open) == iVar10 + open < 0) {
    uVar11 = (ulong)(uint)open | 0x8000000000000000;
  }
  lVar17 = uVar11 + 1;
  iVar10 = matrix->max;
  local_268._8_4_ = (int)lVar17;
  local_268._0_8_ = lVar17;
  local_268._12_4_ = (int)((ulong)lVar17 >> 0x20);
  local_258 = local_268;
  local_248 = local_268;
  local_238 = local_268;
  local_228 = local_268;
  local_178 = local_268;
  local_168 = local_268;
  ppVar9 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar9 != (parasail_result_t *)0x0) {
    ppVar9->flag = ppVar9->flag | 0x2831004;
    local_150 = uVar11;
    ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    uVar11 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar11);
    auVar29._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
    auVar29._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
    auVar45._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
    auVar45._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
    auVar29 = packssdw(auVar29,auVar45);
    auVar44._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
    auVar44._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
    auVar49._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
    auVar49._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
    auVar45 = packssdw(auVar44,auVar49);
    auVar29 = packssdw(auVar29,auVar45);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar29 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar29 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar29 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar29 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar29 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar29 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar29 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar29 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar29 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar29 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf]))
    {
      uVar11 = 0x7ffffffffffffffe - (long)iVar10;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar11;
      lVar24 = (long)_s1Len;
      if (0 < _s1Len) {
        piVar1 = matrix->mapper;
        lVar13 = 0;
        do {
          ptr[lVar13] = (long)piVar1[(byte)_s1[lVar13]];
          lVar13 = lVar13 + 1;
        } while (lVar24 != lVar13);
      }
      uVar51 = (undefined4)(uVar11 >> 0x20);
      auVar53._8_4_ = (int)uVar11;
      auVar53._0_8_ = uVar11;
      auVar53._12_4_ = uVar51;
      local_f8 = local_178._8_8_;
      uStack_f0 = 0;
      local_c8 = open;
      uStack_c4 = 0;
      iStack_c0 = open;
      uStack_bc = 0;
      local_d8._0_8_ = CONCAT44(0,gap);
      local_d8._8_4_ = gap;
      local_d8._12_4_ = 0;
      auVar29 = local_d8;
      ptr[lVar24] = 0;
      piVar1 = matrix->mapper;
      uVar14 = 0;
      do {
        ptr_00[uVar14 + 1] = (long)piVar1[(byte)_s2[uVar14]];
        uVar14 = uVar14 + 1;
      } while (uVar26 != uVar14);
      *ptr_00 = 0;
      ptr_00[uVar26 + 1] = 0;
      uVar14 = 0;
      do {
        ptr_01[uVar14 + 1] = 0;
        ptr_02[uVar14 + 1] = 0;
        ptr_03[uVar14 + 1] = 0;
        ptr_04[uVar14 + 1] = 0;
        ptr_05[uVar14 + 1] = lVar17;
        ptr_06[uVar14 + 1] = 0;
        ptr_07[uVar14 + 1] = 0;
        ptr_08[uVar14 + 1] = 0;
        uVar14 = uVar14 + 1;
      } while (uVar26 != uVar14);
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = lVar17;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      ptr_01[uVar26 + 1] = lVar17;
      ptr_02[uVar26 + 1] = 0;
      ptr_03[uVar26 + 1] = 0;
      ptr_04[uVar26 + 1] = 0;
      ptr_05[uVar26 + 1] = lVar17;
      ptr_06[uVar26 + 1] = 0;
      ptr_07[uVar26 + 1] = 0;
      ptr_08[uVar26 + 1] = 0;
      *ptr_01 = 0;
      local_258._0_8_ = local_178._0_8_;
      local_258._8_8_ = local_178._8_8_;
      local_228._0_8_ = local_178._0_8_;
      local_228._8_8_ = local_178._8_8_;
      lVar13 = local_178._0_8_;
      uVar14 = local_178._8_8_;
      local_238._0_8_ = local_178._0_8_;
      local_238._8_8_ = local_178._8_8_;
      local_248._0_8_ = local_178._0_8_;
      local_248._8_8_ = local_178._8_8_;
      if (0 < _s1Len) {
        local_208 = auVar53;
        local_118 = auVar46;
        local_138 = matrix->matrix;
        local_128 = (ulong)(s2Len + 1);
        auVar70._4_4_ = _s1Len;
        auVar70._0_4_ = _s1Len;
        auVar70._8_8_ = 0;
        local_108 = pmovzxdq(auVar70,auVar70);
        auVar45 = local_108;
        auVar76._4_4_ = s2Len;
        auVar76._0_4_ = s2Len;
        auVar76._8_8_ = 0;
        local_e8 = pmovzxdq(auVar76,auVar76);
        auVar44 = local_e8;
        lVar13 = uVar26 * 4 + -4;
        local_140 = uVar26 * 8;
        auVar47 = pmovsxbq(auVar46,1);
        lVar25 = 0;
        uVar14 = 0;
        local_218 = local_178;
        local_1a8 = local_178;
        local_198 = local_178;
        local_188 = local_178;
        local_1b8 = local_178;
        local_148 = ptr_04;
        do {
          uStack_a0 = ptr[uVar14];
          local_a8 = ptr[uVar14 + 1];
          iVar10 = matrix->size;
          uVar22 = _s1Len - 1;
          if ((long)(uVar14 | 1) < lVar24) {
            uVar22 = (uint)uVar14 | 1;
          }
          bVar27 = matrix->type != 0;
          local_130 = uVar14;
          uVar15 = uStack_a0;
          if (bVar27) {
            uVar15 = uVar14;
          }
          uVar18 = (long)(int)uVar22;
          if (!bVar27) {
            uVar18 = local_a8;
          }
          local_120 = local_138 + uVar15 * (long)iVar10;
          local_b8 = -(ulong)(auVar47._0_8_ < (long)local_108._0_8_);
          lVar52 = auVar47._8_8_;
          lStack_b0 = -(ulong)(lVar52 < (long)local_108._8_8_);
          uVar16 = 0;
          lVar78 = -1;
          lStack_2d0 = 0;
          local_1d8._8_8_ = 0;
          local_88._8_8_ = 0;
          uStack_2a0 = 0;
          auVar53 = (undefined1  [16])0x0;
          auVar46 = (undefined1  [16])0x0;
          auVar70 = ZEXT816(0);
          local_278 = local_178;
          auVar76 = (undefined1  [16])0x0;
          local_308 = ZEXT816(0);
          local_298 = ZEXT816(0);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_178._8_8_;
          local_98 = auVar47;
          auVar49 = auVar64;
          uVar75 = local_178._8_8_;
          uVar67 = local_178._8_8_;
          lVar21 = 0;
          lVar69 = 0;
          lVar62 = 0;
          lVar73 = 0;
          lVar80 = 0;
          lVar81 = 0;
          do {
            local_78 = auVar49._8_8_;
            lStack_70 = ptr_01[uVar16 + 1];
            local_68._0_8_ = CONCAT44(local_298._4_4_,local_298._8_4_);
            iVar2 = ptr_02[uVar16 + 1];
            local_68._8_8_ = iVar2;
            local_58._0_8_ = CONCAT44(local_308._4_4_,local_308._8_4_);
            iVar3 = ptr_03[uVar16 + 1];
            local_58._8_8_ = iVar3;
            local_48._0_8_ = auVar76._8_8_;
            iVar4 = ptr_04[uVar16 + 1];
            local_48._8_8_ = iVar4;
            auVar77._8_8_ = ptr_06[uVar16 + 1];
            auVar77._0_8_ = uStack_2a0;
            auVar85._8_8_ = ptr_07[uVar16 + 1];
            auVar85._0_8_ = local_88._8_8_;
            auVar82._8_8_ = ptr_08[uVar16 + 1];
            auVar82._0_8_ = local_1d8._8_8_;
            auVar72._0_8_ = local_78 - (ulong)(uint)open;
            auVar72._8_8_ = lStack_70 - (ulong)(uint)open;
            local_d8._12_4_ = 0;
            auVar74._0_8_ = uVar75 - local_d8._0_8_;
            auVar74._8_8_ = ptr_05[uVar16 + 1] - local_d8._8_8_;
            auVar48._0_8_ = -(ulong)(auVar74._0_8_ < auVar72._0_8_);
            auVar48._8_8_ = -(ulong)(auVar74._8_8_ < auVar72._8_8_);
            auVar77 = blendvpd(auVar77,local_68,auVar48);
            local_88 = blendvpd(auVar85,local_58,auVar48);
            auVar83 = blendvpd(auVar82,local_48,auVar48);
            auVar68._0_8_ = auVar49._0_8_ - (ulong)(uint)open;
            auVar68._8_8_ = local_78 - (ulong)(uint)open;
            auVar63._0_8_ = local_278._0_8_ - local_d8._0_8_;
            auVar63._8_8_ = local_278._8_8_ - local_d8._8_8_;
            auVar54._0_8_ = -(ulong)(auVar63._0_8_ < auVar68._0_8_);
            auVar54._8_8_ = -(ulong)(auVar63._8_8_ < auVar68._8_8_);
            auVar70 = blendvpd(auVar70,local_298,auVar54);
            local_318._8_8_ = auVar70._8_8_;
            auVar46 = blendvpd(auVar46,local_308,auVar54);
            auVar79 = blendvpd(auVar53,auVar76,auVar54);
            uVar5 = ptr_00[uVar16 + 1];
            iVar12 = (local_138 + uVar15 * (long)iVar10)[uVar5];
            local_1c8 = auVar64._0_8_;
            uStack_1c0 = auVar64._8_8_;
            auVar40._0_8_ = (long)local_138[uVar18 * (long)iVar10 + ptr_00[uVar16]] + local_1c8;
            auVar40._8_8_ = (long)iVar12 + uStack_1c0;
            local_1e8 = blendvpd(auVar74,auVar72,auVar48);
            auVar64 = blendvpd(auVar63,auVar68,auVar54);
            auVar30._0_8_ = -(ulong)(auVar64._0_8_ < auVar40._0_8_);
            auVar30._8_8_ = -(ulong)(auVar64._8_8_ < (long)auVar40._8_8_);
            auVar49 = blendvpd(auVar64,auVar40,auVar30);
            auVar31._0_4_ = -(uint)(0 < local_138[uVar18 * (long)iVar10 + ptr_00[uVar16]]);
            auVar31._4_4_ = -(uint)(0 < iVar12);
            auVar31._8_8_ = 0;
            auVar53 = pmovzxdq(local_48,auVar31);
            auVar76 = pmovsxbq(auVar46,0x101);
            auVar58._0_8_ = SUB168(auVar53 & auVar76,0) + lVar62;
            auVar58._8_8_ = SUB168(auVar53 & auVar76,8) + lVar73;
            lVar73 = local_1e8._0_8_;
            auVar32._0_8_ = -(ulong)(lVar73 < auVar49._0_8_);
            uVar75 = local_1e8._8_8_;
            auVar32._8_8_ = -(ulong)((long)uVar75 < auVar49._8_8_);
            auVar53 = blendvpd(local_1e8,auVar49,auVar32);
            auVar55._0_8_ = -(ulong)(0 < auVar53._0_8_);
            auVar55._8_8_ = -(ulong)(0 < auVar53._8_8_);
            auVar55 = auVar55 & auVar53;
            auVar50._0_8_ = -(ulong)(auVar55._0_8_ == lVar73);
            auVar50._8_8_ = -(ulong)(auVar55._8_8_ == uVar75);
            auVar49 = blendvpd(auVar70,auVar77,auVar50);
            auVar41._0_8_ = -(ulong)(auVar40._0_8_ == auVar55._0_8_);
            auVar41._8_8_ = -(ulong)(auVar40._8_8_ == auVar55._8_8_);
            uStack_1c0 = uVar5;
            local_1c8 = uVar67;
            auVar71._0_8_ = lVar80 + (ulong)(local_a8 == uVar67);
            auVar71._8_8_ = lVar81 + (ulong)(uStack_a0 == uVar5);
            local_298 = blendvpd(auVar49,auVar71,auVar41);
            auVar49 = blendvpd(auVar46,local_88,auVar50);
            local_308 = blendvpd(auVar49,auVar58,auVar41);
            auVar59._8_4_ = 0xffffffff;
            auVar59._0_8_ = 0xffffffffffffffff;
            auVar59._12_4_ = 0xffffffff;
            local_1d8._0_8_ = auVar83._0_8_ + 1;
            lVar62 = auVar59._8_8_;
            local_1d8._8_8_ = auVar83._8_8_ - lVar62;
            local_1f8._0_8_ = auVar79._0_8_ + 1;
            local_1f8._8_8_ = auVar79._8_8_ - lVar62;
            auVar83._0_8_ = -(ulong)(auVar53._0_8_ < auVar76._0_8_);
            auVar83._8_8_ = -(ulong)(auVar53._8_8_ < auVar76._8_8_);
            auVar49 = blendvpd(local_1f8,local_1d8,auVar50);
            auVar79._0_8_ = lVar21 + 1;
            auVar79._8_8_ = lVar69 - lVar62;
            auVar76 = blendvpd(auVar49,auVar79,auVar41);
            auVar86._0_8_ = -(ulong)(lVar78 == -1);
            auVar86._8_8_ = -(ulong)(lStack_2d0 == lVar62);
            auVar83 = auVar83 | auVar86;
            local_298 = ~auVar83 & local_298;
            local_308 = ~auVar83 & local_308;
            local_278 = blendvpd(auVar64,local_178,auVar86);
            auVar76 = ~auVar83 & auVar76;
            auVar49 = ~auVar86 & auVar55;
            lVar21 = auVar49._0_8_;
            lVar69 = auVar49._8_8_;
            if (1 < uVar16) {
              auVar33._0_8_ = -(ulong)(local_208._0_8_ < lVar21);
              auVar33._8_8_ = -(ulong)(local_208._8_8_ < lVar69);
              local_208 = blendvpd(auVar49,local_208,auVar33);
              auVar34._0_8_ = -(ulong)(lVar21 < local_218._0_8_);
              auVar34._8_8_ = -(ulong)(lVar69 < local_218._8_8_);
              auVar53 = blendvpd(auVar49,local_218,auVar34);
              auVar35._0_8_ = -(ulong)(local_298._0_8_ < auVar53._0_8_);
              auVar35._8_8_ = -(ulong)(local_298._8_8_ < auVar53._8_8_);
              auVar53 = blendvpd(local_298,auVar53,auVar35);
              auVar36._0_8_ = -(ulong)(local_308._0_8_ < auVar53._0_8_);
              auVar36._8_8_ = -(ulong)(local_308._8_8_ < auVar53._8_8_);
              auVar53 = blendvpd(local_308,auVar53,auVar36);
              auVar37._0_8_ = -(ulong)(auVar76._0_8_ < auVar53._0_8_);
              auVar37._8_8_ = -(ulong)(auVar76._8_8_ < auVar53._8_8_);
              local_218 = blendvpd(auVar76,auVar53,auVar37);
            }
            lVar62 = *((ppVar9->field_4).trace)->trace_del_table;
            if (uVar16 < uVar26) {
              *(int *)(lVar62 + lVar25 + uVar16 * 4) = auVar49._8_4_;
            }
            bVar27 = (long)(uVar14 | 1) < lVar24;
            bVar28 = uVar16 != 0;
            if (bVar28 && bVar27) {
              *(int *)(lVar62 + lVar13 + uVar16 * 4) = auVar49._0_4_;
            }
            lVar62 = *(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 8);
            if (uVar16 < uVar26) {
              *(int *)(lVar62 + lVar25 + uVar16 * 4) = local_298._8_4_;
            }
            if (bVar28 && bVar27) {
              *(int *)(lVar62 + lVar13 + uVar16 * 4) = local_298._0_4_;
            }
            lVar62 = *(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x10);
            if (uVar16 < uVar26) {
              *(int *)(lVar62 + lVar25 + uVar16 * 4) = local_308._8_4_;
            }
            if (bVar28 && bVar27) {
              *(int *)(lVar62 + lVar13 + uVar16 * 4) = local_308._0_4_;
            }
            lVar62 = *(long *)((long)((ppVar9->field_4).trace)->trace_del_table + 0x18);
            if (uVar16 < uVar26) {
              *(int *)(lVar62 + lVar25 + uVar16 * 4) = auVar76._8_4_;
            }
            if (bVar28 && bVar27) {
              *(int *)(lVar62 + lVar13 + uVar16 * 4) = auVar76._0_4_;
            }
            ptr_01[uVar16] = lVar21;
            ptr_02[uVar16] = local_298._0_8_;
            ptr_03[uVar16] = local_308._0_8_;
            ptr_04[uVar16] = auVar76._0_8_;
            ptr_05[uVar16] = lVar73;
            local_2a8 = auVar77._0_8_;
            ptr_06[uVar16] = local_2a8;
            auVar41 = local_88;
            ptr_07[uVar16] = local_88._0_8_;
            ptr_08[uVar16] = local_1d8._0_8_;
            auVar6._8_8_ = lStack_2d0;
            auVar6._0_8_ = lVar78;
            auVar66._0_8_ = -(ulong)(-1 < lVar78);
            auVar66._8_8_ = -(ulong)(-1 < lStack_2d0);
            auVar65._0_8_ = -(ulong)(lVar78 < (long)local_e8._0_8_);
            auVar65._8_8_ = -(ulong)(lStack_2d0 < (long)local_e8._8_8_);
            auVar7._8_8_ = lStack_b0;
            auVar7._0_8_ = local_b8;
            auVar66 = auVar65 & auVar7 & auVar66;
            auVar42._0_8_ = -(ulong)(lVar21 == local_168._0_8_);
            auVar42._8_8_ = -(ulong)(lVar69 == local_168._8_8_);
            auVar84._0_8_ = -(ulong)(local_168._0_8_ < lVar21);
            auVar84._8_8_ = -(ulong)(local_168._8_8_ < lVar69);
            local_168 = blendvpd(local_168,auVar55,auVar84 & auVar66);
            auVar70 = ~auVar86 & auVar70;
            auVar56._0_8_ = -(ulong)(lVar78 < local_268._0_8_);
            auVar56._8_8_ = -(ulong)(lStack_2d0 < local_268._8_8_);
            auVar64 = blendvpd(auVar84 & auVar66,auVar66,auVar56 & auVar42);
            local_1a8 = blendvpd(local_1a8,local_298,auVar64);
            auVar31 = local_1a8;
            auVar46 = ~auVar86 & auVar46;
            local_198 = blendvpd(local_198,local_308,auVar64);
            auVar32 = local_198;
            auVar53 = ~auVar86 & local_1f8;
            local_188 = blendvpd(local_188,auVar76,auVar64);
            auVar40 = local_188;
            auVar60._8_4_ = 0xffffffff;
            auVar60._0_8_ = 0xffffffffffffffff;
            auVar60._12_4_ = 0xffffffff;
            local_1b8 = blendvpd(local_1b8,auVar47,auVar64);
            auVar30 = local_1b8;
            local_268 = blendvpd(local_268,auVar6,(auVar56 & auVar42 | auVar84) & auVar66);
            lVar78 = lVar78 + 1;
            lStack_2d0 = lStack_2d0 - auVar60._8_8_;
            uVar16 = uVar16 + 1;
            uStack_2a0 = auVar77._8_8_;
            auVar64._8_8_ = lStack_70;
            auVar64._0_8_ = local_78;
            uVar67 = uVar5;
            lVar21 = local_48._0_8_;
            lVar69 = iVar4;
            lVar62 = local_58._0_8_;
            lVar73 = iVar3;
            lVar80 = local_68._0_8_;
            lVar81 = iVar2;
          } while (s2Len + 1 != uVar16);
          auVar47._0_8_ = auVar47._0_8_ + 2;
          auVar47._8_8_ = lVar52 + 2;
          uVar14 = uVar14 + 2;
          lVar25 = lVar25 + local_140;
          lVar13 = lVar13 + local_140;
        } while ((long)uVar14 < lVar24);
        auVar53 = local_208;
        local_258._0_8_ = local_1b8._0_8_;
        local_258._8_8_ = local_1b8._8_8_;
        local_228._0_8_ = local_1a8._0_8_;
        local_228._8_8_ = local_1a8._8_8_;
        lVar13 = local_218._0_8_;
        uVar14 = local_218._8_8_;
        local_238._0_8_ = local_198._0_8_;
        local_238._8_8_ = local_198._8_8_;
        local_248._0_8_ = local_188._0_8_;
        local_248._8_8_ = local_188._8_8_;
        local_1b8 = auVar30;
        local_1a8 = auVar31;
        local_198 = auVar32;
        local_188 = auVar40;
        local_108 = auVar45;
        local_e8 = auVar44;
        local_88 = auVar41;
      }
      lVar21 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_318._8_8_;
      local_318 = auVar8 << 0x40;
      iVar10 = 0;
      lVar78 = lVar17;
      lVar24 = lVar17;
      lVar25 = lVar17;
      bVar27 = true;
      do {
        bVar28 = bVar27;
        lVar69 = *(long *)(local_168 + lVar21);
        if (lVar78 < lVar69) {
          lVar17 = *(long *)(local_228 + lVar21);
          lVar24 = *(long *)(local_238 + lVar21);
          lVar25 = *(long *)(local_248 + lVar21);
          local_318._4_4_ = 0;
          local_318._0_4_ = *(uint *)(local_258 + lVar21);
          lVar78 = lVar69;
          iVar10 = *(int *)(local_268 + lVar21);
        }
        else if (lVar69 == lVar78) {
          lVar69 = *(long *)(local_268 + lVar21);
          if (lVar69 < iVar10) {
            lVar17 = *(long *)(local_228 + lVar21);
            lVar24 = *(long *)(local_238 + lVar21);
            lVar25 = *(long *)(local_248 + lVar21);
            local_318._4_4_ = 0;
            local_318._0_4_ = *(uint *)(local_258 + lVar21);
            iVar10 = (int)lVar69;
          }
          else if (lVar69 == iVar10) {
            if (*(long *)(local_258 + lVar21) < (long)(int)local_318._0_4_) {
              lVar17 = *(long *)(local_228 + lVar21);
              lVar24 = *(long *)(local_238 + lVar21);
              lVar25 = *(long *)(local_248 + lVar21);
              local_318._0_8_ = *(long *)(local_258 + lVar21);
              iVar10 = (int)lVar69;
            }
          }
        }
        iVar19 = (int)lVar24;
        iVar12 = (int)lVar17;
        iVar23 = (int)lVar25;
        lVar21 = lVar21 + 8;
        bVar27 = false;
      } while (bVar28);
      auVar38._8_4_ = (int)local_150;
      auVar38._0_8_ = local_150;
      auVar38._12_4_ = (int)(local_150 >> 0x20);
      auVar57._0_8_ = -(ulong)((long)local_150 < auVar53._0_8_);
      auVar57._8_8_ = -(ulong)(auVar38._8_8_ < auVar53._8_8_);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar43._8_4_ = (int)uVar11;
      auVar43._0_8_ = uVar11;
      auVar43._12_4_ = uVar51;
      auVar61._0_8_ = -(ulong)((long)uVar11 < lVar13);
      auVar61._8_8_ = -(ulong)(auVar43._8_8_ < (long)uVar14);
      iVar20 = movmskpd((int)lVar21,auVar61 | auVar39 ^ auVar57);
      if (iVar20 != 0) {
        *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
        local_318._0_4_ = 0;
        iVar10 = 0;
        lVar78 = 0;
        iVar12 = 0;
        iVar19 = 0;
        iVar23 = 0;
      }
      ppVar9->score = (int)lVar78;
      ppVar9->end_query = local_318._0_4_;
      ppVar9->end_ref = iVar10;
      ((ppVar9->field_4).stats)->matches = iVar12;
      ((ppVar9->field_4).stats)->similar = iVar19;
      ((ppVar9->field_4).stats)->length = iVar23;
      local_d8 = auVar29;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar9;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            case0 = _mm_cmpeq_epi64(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}